

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoboteqInterface.cpp
# Opt level: O0

void * RoboteqInterfaceThread(void *pParam)

{
  bool bVar1;
  int iVar2;
  BOOL bConnected;
  void *pParam_local;
  
  if ((szRoboteqInterfacePath[0] == ':') && (iVar2 = atoi(szRoboteqInterfacePath + 1), 0 < iVar2)) {
    RoboteqInterfacePseudoRS232Port.DevType = 2;
    do {
      iVar2 = LaunchMultiCliTCPSrv(szRoboteqInterfacePath + 1,handleroboteqinterfacecli,(void *)0x0)
      ;
      if (iVar2 == 0) break;
      printf("Error launching the RoboteqInterface server.\n");
      mSleep(4000);
    } while (bExit == 0);
  }
  else {
    bVar1 = false;
    do {
      if (bVar1) {
        iVar2 = handleroboteqinterface(&RoboteqInterfacePseudoRS232Port);
        if (iVar2 != 0) {
          printf("Connection to a RoboteqInterface lost.\n");
          bVar1 = false;
          disconnectroboteqinterface(&RoboteqInterfacePseudoRS232Port);
          uSleep(50000);
        }
      }
      else {
        iVar2 = connectroboteqinterface(&RoboteqInterfacePseudoRS232Port);
        if (iVar2 != 0) {
          mSleep(1000);
        }
        else {
          uSleep(50000);
          inithandleroboteqinterface(&RoboteqInterfacePseudoRS232Port);
        }
        bVar1 = iVar2 == 0;
      }
    } while (bExit == 0);
    if (bVar1) {
      disconnectroboteqinterface(&RoboteqInterfacePseudoRS232Port);
    }
  }
  if (bExit == 0) {
    bExit = 1;
  }
  return (void *)0x0;
}

Assistant:

THREAD_PROC_RETURN_VALUE RoboteqInterfaceThread(void* pParam)
{
	//CHRONO chrono;
	//double dt = 0, t = 0, t0 = 0;
	//struct timeval tv;

	UNREFERENCED_PARAMETER(pParam);

	//EnterCriticalSection(&strtimeCS);
	//sprintf(roboteqinterfacefilename, LOG_FOLDER"roboteqinterface_%.64s.txt", strtimeex_fns());
	//LeaveCriticalSection(&strtimeCS);
	//roboteqinterfacefile = fopen(roboteqinterfacefilename, "w");
	//if (roboteqinterfacefile == NULL)
	//{
	//	printf("Unable to create roboteqinterface file.\n");
	//	if (!bExit) bExit = TRUE; // Unexpected program exit...
	//	return 0;
	//}

	// Try to determine whether it is a server TCP port.
	if ((szRoboteqInterfacePath[0] == ':')&&(atoi(szRoboteqInterfacePath+1) > 0))
	{
		RoboteqInterfacePseudoRS232Port.DevType = TCP_SERVER_TYPE_RS232PORT;
		while (LaunchMultiCliTCPSrv(szRoboteqInterfacePath+1, handleroboteqinterfacecli, NULL) != EXIT_SUCCESS)
		{
			printf("Error launching the RoboteqInterface server.\n");
			mSleep(4000);
			if (bExit) break;
		}
	}
	else
	{
		BOOL bConnected = FALSE;

		//t = 0;

		//StartChrono(&chrono);

		for (;;)
		{
			//uSleep(1000*50);
			//t0 = t;
			//GetTimeElapsedChrono(&chrono, &t);
			//dt = t-t0;

			//printf("RoboteqInterfaceThread period : %f s.\n", dt);

			if (!bConnected)
			{
				if (connectroboteqinterface(&RoboteqInterfacePseudoRS232Port) == EXIT_SUCCESS) 
				{
					uSleep(1000*50);
					bConnected = TRUE; 

					inithandleroboteqinterface(&RoboteqInterfacePseudoRS232Port);
				}
				else 
				{
					bConnected = FALSE;
					mSleep(1000);
				}
			}
			else
			{
				//// Time...
				//if (gettimeofday(&tv, NULL) != EXIT_SUCCESS)
				//{
				//	tv.tv_sec = 0;
				//	tv.tv_usec = 0;
				//}

				if (handleroboteqinterface(&RoboteqInterfacePseudoRS232Port) != EXIT_SUCCESS)
				{
					printf("Connection to a RoboteqInterface lost.\n");
					bConnected = FALSE;
					disconnectroboteqinterface(&RoboteqInterfacePseudoRS232Port);
					uSleep(1000*50);
				}
			}

			if (bExit) break;
		}

		//StopChrono(&chrono, &t);

		if (bConnected) disconnectroboteqinterface(&RoboteqInterfacePseudoRS232Port);
	}

	//fclose(roboteqinterfacefile);

	if (!bExit) bExit = TRUE; // Unexpected program exit...

	return 0;
}